

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdash_reporter_tests.c
# Opt level: O0

int mocked_vprinter(FILE *stream,char *format,__va_list_tag *ap)

{
  size_t sVar1;
  __gnuc_va_list in_RDX;
  char *in_RSI;
  char buffer [10000];
  char acStackY_2728 [16];
  char *in_stack_ffffffffffffd8e8;
  char *in_stack_ffffffffffffd8f0;
  
  vsnprintf(acStackY_2728,10000,in_RSI,in_RDX);
  output = concat(in_stack_ffffffffffffd8f0,in_stack_ffffffffffffd8e8);
  sVar1 = strlen(output);
  return (int)sVar1;
}

Assistant:

static int mocked_vprinter(FILE *stream, const char *format, va_list ap) {
    (void)stream;               /* Unused */

    char buffer[10000];
    vsnprintf(buffer, sizeof(buffer), format, ap);
    
    output = concat(output, buffer);
    return strlen(output);
}